

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O1

bool __thiscall
cmFileCopier::InstallSymlinkChain(cmFileCopier *this,string *fromFile,string *toFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  cmCommand *this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  size_t sVar7;
  ostream *poVar8;
  size_type *psVar9;
  ulong *puVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string symlinkTarget;
  string newFromFile;
  string toFilePath;
  string fromFilePath;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  cmsys::SystemTools::GetFilenamePath(&local_1c8,toFile);
  paVar1 = &local_208.field_2;
  do {
    bVar2 = cmsys::SystemTools::ReadSymlink(fromFile,&local_1e8);
    if (!bVar2) {
LAB_0032eafb:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
      return !bVar2;
    }
    bVar3 = cmsys::SystemTools::FileIsFullPath(&local_1e8);
    if (!bVar3) {
      cmsys::SystemTools::GetFilenamePath((string *)local_1a8,fromFile);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,local_1a8._0_8_,(pointer)(local_1a8._0_8_ + local_1a8._8_8_));
      std::__cxx11::string::append((char *)&local_228);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_228,(ulong)local_1e8._M_dataplus._M_p);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_208.field_2._M_allocated_capacity = *psVar9;
        local_208.field_2._8_8_ = plVar6[3];
        local_208._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar9;
        local_208._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_208._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    cmsys::SystemTools::GetFilenameName(&local_208,&local_1e8);
    bVar3 = true;
    if (this->Always == false) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      local_1a8._8_8_ = 0;
      local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
      bVar4 = cmsys::SystemTools::ReadSymlink(toFile,(string *)local_1a8);
      bVar3 = true;
      if ((bVar4) && (local_208._M_string_length == local_1a8._8_8_)) {
        if (local_208._M_string_length == 0) {
          bVar3 = false;
        }
        else {
          iVar5 = bcmp(local_208._M_dataplus._M_p,(void *)local_1a8._0_8_,local_208._M_string_length
                      );
          bVar3 = iVar5 != 0;
        }
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    (*this->_vptr_cmFileCopier[4])(this,toFile,2,(ulong)bVar3);
    if (bVar3 != false) {
      cmsys::SystemTools::RemoveFile(toFile);
      cmsys::SystemTools::MakeDirectory(&local_1c8,(mode_t *)0x0);
      bVar3 = cmSystemTools::CreateSymlink(&local_208,toFile,(string *)0x0);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        __s = this->Name;
        if (__s == (char *)0x0) {
          std::ios::clear((int)&local_228 + (int)*(ulong *)(local_1a8._0_8_ + -0x18) + 0x80);
        }
        else {
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," cannot create symlink \"",0x18);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(toFile->_M_dataplus)._M_p,toFile->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
        this_00 = &this->FileCommand->super_cmCommand;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(this_00,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0032eafb;
      }
    }
    std::__cxx11::string::_M_assign((string *)fromFile);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,local_1c8._M_dataplus._M_p,
               local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
    std::__cxx11::string::append((char *)&local_228);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_228,(ulong)local_208._M_dataplus._M_p);
    puVar10 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar10) {
      local_1a8._16_8_ = *puVar10;
      local_1a8._24_8_ = plVar6[3];
      local_1a8._0_8_ = local_1a8 + 0x10;
    }
    else {
      local_1a8._16_8_ = *puVar10;
      local_1a8._0_8_ = (ulong *)*plVar6;
    }
    local_1a8._8_8_ = plVar6[1];
    *plVar6 = (long)puVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)toFile,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

bool cmFileCopier::InstallSymlinkChain(std::string& fromFile,
                                       std::string& toFile)
{
  std::string newFromFile;
  std::string toFilePath = cmSystemTools::GetFilenamePath(toFile);
  while (cmSystemTools::ReadSymlink(fromFile, newFromFile)) {
    if (!cmSystemTools::FileIsFullPath(newFromFile)) {
      std::string fromFilePath = cmSystemTools::GetFilenamePath(fromFile);
      newFromFile = fromFilePath + "/" + newFromFile;
    }

    std::string symlinkTarget = cmSystemTools::GetFilenameName(newFromFile);

    bool copy = true;
    if (!this->Always) {
      std::string oldSymlinkTarget;
      if (cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget)) {
        if (symlinkTarget == oldSymlinkTarget) {
          copy = false;
        }
      }
    }

    this->ReportCopy(toFile, TypeLink, copy);

    if (copy) {
      cmSystemTools::RemoveFile(toFile);
      cmSystemTools::MakeDirectory(toFilePath);

      if (!cmSystemTools::CreateSymlink(symlinkTarget, toFile)) {
        std::ostringstream e;
        e << this->Name << " cannot create symlink \"" << toFile << "\".";
        this->FileCommand->SetError(e.str());
        return false;
      }
    }

    fromFile = newFromFile;
    toFile = toFilePath + "/" + symlinkTarget;
  }

  return true;
}